

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

void __thiscall iutest::TempFile::~TempFile(TempFile *this)

{
  TempFile *this_local;
  
  ~TempFile(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~TempFile() { Close(); }